

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_measures.cc
# Opt level: O1

void S2::GetChainVertices
               (S2Shape *shape,int chain_id,
               vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices)

{
  pointer *ppVVar1;
  pointer pVVar2;
  iterator iVar3;
  int iVar4;
  int extraout_var;
  uint uVar5;
  Edge edge;
  Vector3<double> local_60;
  Vector3<double> local_48;
  
  (*shape->_vptr_S2Shape[7])();
  iVar4 = (*shape->_vptr_S2Shape[4])(shape);
  iVar4 = (uint)(iVar4 == 1) + extraout_var;
  pVVar2 = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
      super__Vector_impl_data._M_finish != pVVar2) {
    (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::reserve(vertices,(long)iVar4);
  uVar5 = 0;
  if (((long)iVar4 & 1U) != 0) {
    (*shape->_vptr_S2Shape[8])(&local_60,shape,(ulong)(uint)chain_id,0);
    iVar3._M_current =
         (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
      _M_realloc_insert<Vector3<double>>
                ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)vertices,iVar3,&local_60
                );
    }
    else {
      (iVar3._M_current)->c_[2] = local_60.c_[2];
      (iVar3._M_current)->c_[0] = local_60.c_[0];
      (iVar3._M_current)->c_[1] = local_60.c_[1];
      ppVVar1 = &(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
    uVar5 = 1;
  }
  if ((int)uVar5 < iVar4) {
    do {
      (*shape->_vptr_S2Shape[8])(&local_60,shape,(ulong)(uint)chain_id,(ulong)uVar5);
      iVar3._M_current =
           (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)vertices,iVar3,
                   &local_60);
      }
      else {
        (iVar3._M_current)->c_[2] = local_60.c_[2];
        (iVar3._M_current)->c_[0] = local_60.c_[0];
        (iVar3._M_current)->c_[1] = local_60.c_[1];
        ppVVar1 = &(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      iVar3._M_current =
           (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
        _M_realloc_insert<Vector3<double>const&>
                  ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)vertices,iVar3,
                   &local_48);
      }
      else {
        (iVar3._M_current)->c_[2] = local_48.c_[2];
        (iVar3._M_current)->c_[0] = local_48.c_[0];
        (iVar3._M_current)->c_[1] = local_48.c_[1];
        ppVVar1 = &(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      uVar5 = uVar5 + 2;
    } while ((int)uVar5 < iVar4);
  }
  return;
}

Assistant:

void GetChainVertices(const S2Shape& shape, int chain_id,
                      std::vector<S2Point>* vertices) {
  S2Shape::Chain chain = shape.chain(chain_id);
  int num_vertices = chain.length + (shape.dimension() == 1);
  vertices->clear();
  vertices->reserve(num_vertices);
  int e = 0;
  if (num_vertices & 1) {
    vertices->push_back(shape.chain_edge(chain_id, e++).v0);
  }
  for (; e < num_vertices; e += 2) {
    auto edge = shape.chain_edge(chain_id, e);
    vertices->push_back(edge.v0);
    vertices->push_back(edge.v1);
  }
}